

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_pxr24.c
# Opt level: O0

exr_result_t
undo_pxr24_impl(exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
               void *uncompressed_data,uint64_t uncompressed_size,void *scratch_data,
               uint64_t scratch_size)

{
  short sVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long in_RDI;
  ulong in_R8;
  byte *in_R9;
  uint32_t diff_2;
  int x_2;
  uint32_t *dout_2;
  uint32_t pixel_2;
  uint8_t *ptr_2 [3];
  uint32_t diff_1;
  int x_1;
  uint16_t *dout_1;
  uint32_t pixel_1;
  uint8_t *ptr_1 [2];
  uint32_t diff;
  int x;
  uint32_t *dout;
  uint32_t pixel;
  uint8_t *ptr [4];
  uint64_t nBytes;
  int w;
  exr_coding_channel_info_t *curc;
  int c;
  int cury;
  int y;
  uint8_t *lastIn;
  uint64_t nDec;
  uint64_t nOut;
  uint8_t *out;
  exr_result_t rstat;
  size_t outSize;
  uint32_t uVar6;
  undefined4 uVar7;
  uint in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  byte *local_118;
  byte *local_110;
  byte *local_108;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar8;
  size_t in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  size_t in_stack_ffffffffffffff18;
  void *in_stack_ffffffffffffff20;
  exr_const_context_t_conflict in_stack_ffffffffffffff28;
  int local_cc;
  int local_74;
  int local_6c;
  byte *local_68;
  long local_60;
  long local_58;
  exr_result_t local_4;
  
  local_58 = 0;
  local_60 = 0;
  if (_diff_2 < in_R8) {
    local_4 = 3;
  }
  else {
    local_4 = exr_uncompress_buffer
                        (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff18,
                         (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         in_stack_ffffffffffffff08,
                         (size_t *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    if (local_4 == 0) {
      local_68 = in_R9;
      for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x2c); local_6c = local_6c + 1) {
        iVar2 = *(int *)(in_RDI + 0x28);
        for (local_74 = 0; local_74 < *(short *)(in_RDI + 0x10); local_74 = local_74 + 1) {
          lVar4 = *(long *)(in_RDI + 8) + (long)local_74 * 0x30;
          iVar3 = *(int *)(lVar4 + 0xc);
          lVar5 = (long)iVar3 * (long)*(char *)(lVar4 + 0x19);
          if ((*(int *)(lVar4 + 8) != 0) &&
             ((*(int *)(lVar4 + 0x14) < 2 || ((local_6c + iVar2) % *(int *)(lVar4 + 0x14) == 0)))) {
            if (in_R8 < (ulong)(local_58 + lVar5)) {
              return 1;
            }
            sVar1 = *(short *)(lVar4 + 0x1a);
            if (sVar1 == 0) {
              local_68 = local_68 + (long)iVar3 + (long)iVar3 + (long)iVar3 + (long)iVar3;
              if (in_R8 < (ulong)(local_60 + lVar5)) {
                return 0x17;
              }
              uVar6 = 0;
              for (local_cc = 0; local_cc < iVar3; local_cc = local_cc + 1) {
                unaligned_store32((void *)CONCAT44(in_stack_fffffffffffffed4,
                                                   in_stack_fffffffffffffed0),uVar6);
              }
              local_60 = lVar5 + local_60;
            }
            else if (sVar1 == 1) {
              local_68 = local_68 + (long)iVar3 + (long)iVar3;
              if (in_R8 < (ulong)(local_60 + lVar5)) {
                return 0x17;
              }
              uVar7 = 0;
              for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
                unaligned_store16((void *)CONCAT44(in_stack_fffffffffffffed4,
                                                   in_stack_fffffffffffffed0),
                                  (uint16_t)((uint)uVar7 >> 0x10));
              }
              local_60 = lVar5 + local_60;
            }
            else {
              if (sVar1 != 2) {
                return 3;
              }
              local_118 = local_68;
              local_110 = local_68 + iVar3;
              local_68 = local_110 + iVar3 + iVar3;
              if (in_R8 < (ulong)(local_60 + iVar3 * 3)) {
                return 0x17;
              }
              uVar6 = 2;
              local_108 = local_110 + iVar3;
              for (in_stack_fffffffffffffed4 = 0; in_stack_fffffffffffffed4 < iVar3;
                  in_stack_fffffffffffffed4 = in_stack_fffffffffffffed4 + 1) {
                in_stack_fffffffffffffed0 =
                     (uint)*local_118 << 0x18 | (uint)*local_110 << 0x10 | (uint)*local_108 << 8;
                unaligned_store32((void *)CONCAT44(in_stack_fffffffffffffed4,
                                                   in_stack_fffffffffffffed0),uVar6);
                local_118 = local_118 + 1;
                local_110 = local_110 + 1;
                local_108 = local_108 + 1;
              }
              local_60 = iVar3 * 3 + local_60;
            }
            local_58 = lVar5 + local_58;
          }
        }
      }
      *(long *)(in_RDI + 0x68) = local_58;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static exr_result_t
undo_pxr24_impl (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size,
    void*                  scratch_data,
    uint64_t               scratch_size)
{
    size_t         outSize;
    exr_result_t   rstat;
    uint8_t*       out    = uncompressed_data;
    uint64_t       nOut   = 0;
    uint64_t       nDec   = 0;
    const uint8_t* lastIn = scratch_data;

    if (scratch_size < uncompressed_size) return EXR_ERR_INVALID_ARGUMENT;

    rstat = exr_uncompress_buffer (
        decode->context,
        compressed_data,
        comp_buf_size,
        scratch_data,
        scratch_size,
        &outSize);

    if (rstat != EXR_ERR_SUCCESS) return rstat;

    for (int y = 0; y < decode->chunk.height; ++y)
    {
        int cury = y + decode->chunk.start_y;

        for (int c = 0; c < decode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc = decode->channels + c;
            int                              w    = curc->width;
            uint64_t                         nBytes =
                (uint64_t) (w) * (uint64_t) (curc->bytes_per_element);

            if (curc->height == 0 ||
                (curc->y_samples > 1 && (cury % curc->y_samples) != 0))
                continue;

            if (nOut + nBytes > uncompressed_size)
                return EXR_ERR_OUT_OF_MEMORY;

            switch (curc->data_type)
            {
                case EXR_PIXEL_UINT: {
                    const uint8_t* ptr[4];
                    uint32_t       pixel = 0;
                    uint32_t*      dout  = (uint32_t*) (out);

                    ptr[0] = lastIn;
                    lastIn += w;
                    ptr[1] = lastIn;
                    lastIn += w;
                    ptr[2] = lastIn;
                    lastIn += w;
                    ptr[3] = lastIn;
                    lastIn += w;

                    if (nDec + nBytes > uncompressed_size)
                        return EXR_ERR_CORRUPT_CHUNK;

                    for (int x = 0; x < w; ++x)
                    {
                        uint32_t diff =
                            (((uint32_t) (*(ptr[0]++)) << 24) |
                             ((uint32_t) (*(ptr[1]++)) << 16) |
                             ((uint32_t) (*(ptr[2]++)) << 8) |
                             ((uint32_t) (*(ptr[3]++))));
                        pixel += diff;
                        unaligned_store32 (dout, pixel);
                        ++dout;
                    }
                    nDec += nBytes;
                    break;
                }
                case EXR_PIXEL_HALF: {
                    const uint8_t* ptr[2];
                    uint32_t       pixel = 0;
                    uint16_t*      dout  = (uint16_t*) (out);

                    ptr[0] = lastIn;
                    lastIn += w;
                    ptr[1] = lastIn;
                    lastIn += w;

                    if (nDec + nBytes > uncompressed_size)
                        return EXR_ERR_CORRUPT_CHUNK;

                    for (int x = 0; x < w; ++x)
                    {
                        uint32_t diff =
                            (((uint32_t) (*(ptr[0]++)) << 8) |
                             ((uint32_t) (*(ptr[1]++))));
                        pixel += diff;
                        unaligned_store16 (dout, (uint16_t) pixel);
                        ++dout;
                    }
                    nDec += nBytes;
                    break;
                }
                case EXR_PIXEL_FLOAT: {
                    const uint8_t* ptr[3];
                    uint32_t       pixel = 0;
                    uint32_t*      dout  = (uint32_t*) (out);

                    ptr[0] = lastIn;
                    lastIn += w;
                    ptr[1] = lastIn;
                    lastIn += w;
                    ptr[2] = lastIn;
                    lastIn += w;

                    if (nDec + (uint64_t) (w * 3) > uncompressed_size)
                        return EXR_ERR_CORRUPT_CHUNK;

                    for (int x = 0; x < w; ++x)
                    {
                        uint32_t diff =
                            (((uint32_t) (*(ptr[0]++)) << 24) |
                             ((uint32_t) (*(ptr[1]++)) << 16) |
                             ((uint32_t) (*(ptr[2]++)) << 8));
                        pixel += diff;
                        unaligned_store32 (dout, pixel);
                        ++dout;
                    }
                    nDec += (uint64_t) (w * 3);
                    break;
                }
                default: return EXR_ERR_INVALID_ARGUMENT;
            }
            out += nBytes;
            nOut += nBytes;
        }
    }
    decode->bytes_decompressed = nOut;
    return EXR_ERR_SUCCESS;
}